

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O2

void helper_store_dbatu_ppc64(CPUPPCState_conflict2 *env,uint32_t nr,target_ulong value)

{
  target_ulong *ptVar1;
  target_ulong BATu;
  ulong BATu_00;
  ulong mask;
  
  BATu = env->DBAT[0][nr];
  if (BATu == value) {
    return;
  }
  mask = (ulong)(((uint)value & 0x1ffc) << 0xf);
  do_invalidate_BAT(env,BATu,mask);
  BATu_00 = ~mask & value & 0xfffffffffffe0000 | (ulong)((uint)value & 0x1fff);
  env->DBAT[0][nr] = BATu_00;
  ptVar1 = env->DBAT[1] + nr;
  *ptVar1 = *ptVar1 & (mask ^ 0xfffffffffffe007b);
  do_invalidate_BAT(env,BATu_00,mask);
  return;
}

Assistant:

void helper_store_dbatu(CPUPPCState *env, uint32_t nr, target_ulong value)
{
    target_ulong mask;
#if defined(FLUSH_ALL_TLBS)
    PowerPCCPU *cpu = env_archcpu(env);
#endif

    dump_store_bat(env, 'D', 0, nr, value);
    if (env->DBAT[0][nr] != value) {
        /*
         * When storing valid upper BAT, mask BEPI and BRPN and
         * invalidate all TLBs covered by this BAT
         */
        mask = (value << 15) & 0x0FFE0000UL;
#if !defined(FLUSH_ALL_TLBS)
        do_invalidate_BAT(env, env->DBAT[0][nr], mask);
#endif
        mask = (value << 15) & 0x0FFE0000UL;
        env->DBAT[0][nr] = (value & 0x00001FFFUL) |
            (value & ~0x0001FFFFUL & ~mask);
        env->DBAT[1][nr] = (env->DBAT[1][nr] & 0x0000007B) |
            (env->DBAT[1][nr] & ~0x0001FFFF & ~mask);
#if !defined(FLUSH_ALL_TLBS)
        do_invalidate_BAT(env, env->DBAT[0][nr], mask);
#else
        tlb_flush(env_cpu(env));
#endif
    }
}